

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O2

Cluster * __thiscall mkvparser::Segment::GetNext(Segment *this,Cluster *pCurr)

{
  Cluster **ppCVar1;
  Cluster **ppCVar2;
  ulong uVar3;
  ulong uVar4;
  undefined1 auVar5 [16];
  Segment *pSVar6;
  bool bVar7;
  longlong lVar8;
  longlong lVar9;
  long lVar10;
  Cluster *pCVar11;
  long lVar12;
  long lVar13;
  Cluster **ppCVar14;
  long lVar15;
  Cluster **ppCVar16;
  long len;
  Cluster *local_50;
  Segment *local_48;
  long len_;
  longlong pos_;
  
  if (pCurr == (Cluster *)0x0) {
    __assert_fail("pCurr",
                  "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x9de,"const Cluster *mkvparser::Segment::GetNext(const Cluster *)");
  }
  local_50 = &this->m_eos;
  if (local_50 == pCurr) {
    __assert_fail("pCurr != &m_eos",
                  "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x9df,"const Cluster *mkvparser::Segment::GetNext(const Cluster *)");
  }
  ppCVar2 = this->m_clusters;
  if (ppCVar2 == (Cluster **)0x0) {
    __assert_fail("m_clusters",
                  "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x9e0,"const Cluster *mkvparser::Segment::GetNext(const Cluster *)");
  }
  uVar3 = pCurr->m_index;
  if ((long)uVar3 < 0) {
    if (this->m_clusterPreloadCount < 1) {
      __assert_fail("m_clusterPreloadCount > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                    ,0x9f6,"const Cluster *mkvparser::Segment::GetNext(const Cluster *)");
    }
    if (this->m_size < 0) {
      __assert_fail("m_size >= 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                    ,0x9fa,"const Cluster *mkvparser::Segment::GetNext(const Cluster *)");
    }
    lVar15 = pCurr->m_element_start;
    lVar13 = this->m_size + this->m_start;
    lVar8 = GetUIntLength(this->m_pReader,lVar15,&len);
    if (lVar8 != 0) {
      __assert_fail("result == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                    ,0xa01,"const Cluster *mkvparser::Segment::GetNext(const Cluster *)");
    }
    if (lVar13 < len + lVar15) {
      __assert_fail("(pos + len) <= stop",
                    "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                    ,0xa02,"const Cluster *mkvparser::Segment::GetNext(const Cluster *)");
    }
    lVar8 = ReadID(this->m_pReader,lVar15,&len);
    if (lVar8 == 0x1f43b675) {
      lVar15 = lVar15 + len;
      lVar8 = GetUIntLength(this->m_pReader,lVar15,&len);
      if (lVar8 != 0) {
        __assert_fail("result == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                      ,0xa0e,"const Cluster *mkvparser::Segment::GetNext(const Cluster *)");
      }
      if (lVar13 < len + lVar15) {
        __assert_fail("(pos + len) <= stop",
                      "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                      ,0xa0f,"const Cluster *mkvparser::Segment::GetNext(const Cluster *)");
      }
      lVar8 = ReadUInt(this->m_pReader,lVar15,&len);
      if (lVar8 < 1) {
        __assert_fail("size > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                      ,0xa12,"const Cluster *mkvparser::Segment::GetNext(const Cluster *)");
      }
      lVar15 = lVar8 + lVar15 + len;
      if (lVar13 < lVar15) {
        __assert_fail("(pos + size) <= stop",
                      "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                      ,0xa16,"const Cluster *mkvparser::Segment::GetNext(const Cluster *)");
      }
      local_50 = (Cluster *)0x0;
      local_48 = this;
      do {
        do {
          lVar12 = lVar15;
          pSVar6 = local_48;
          if (lVar13 <= lVar12) {
            return local_50;
          }
          lVar8 = GetUIntLength(local_48->m_pReader,lVar12,&len);
          if (lVar8 != 0) {
            __assert_fail("result == 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                          ,0xa23,"const Cluster *mkvparser::Segment::GetNext(const Cluster *)");
          }
          if (lVar13 < len + lVar12) {
            __assert_fail("(pos + len) <= stop",
                          "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                          ,0xa24,"const Cluster *mkvparser::Segment::GetNext(const Cluster *)");
          }
          lVar8 = ReadID(pSVar6->m_pReader,lVar12,&len);
          if (lVar8 < 0) goto LAB_001129d1;
          lVar15 = len + lVar12;
          lVar9 = GetUIntLength(pSVar6->m_pReader,lVar15,&len);
          if (lVar9 != 0) {
            __assert_fail("result == 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                          ,0xa32,"const Cluster *mkvparser::Segment::GetNext(const Cluster *)");
          }
          if (lVar13 < len + lVar15) {
            __assert_fail("(pos + len) <= stop",
                          "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                          ,0xa33,"const Cluster *mkvparser::Segment::GetNext(const Cluster *)");
          }
          lVar9 = ReadUInt(pSVar6->m_pReader,lVar15,&len);
          if (lVar9 < 0) {
            __assert_fail("size >= 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                          ,0xa36,"const Cluster *mkvparser::Segment::GetNext(const Cluster *)");
          }
          lVar10 = lVar15 + len + lVar9;
          if (lVar13 < lVar10) {
            __assert_fail("(pos + size) <= stop",
                          "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                          ,0xa39,"const Cluster *mkvparser::Segment::GetNext(const Cluster *)");
          }
          lVar15 = lVar15 + len;
        } while ((lVar9 == 0) || (lVar15 = lVar10, lVar8 != 0x1f43b675));
        lVar12 = lVar12 - local_48->m_start;
        lVar10 = Cluster::HasBlockEntries(local_48,lVar12,&pos_,&len_);
        pSVar6 = local_48;
        if (lVar10 < 0) {
          __assert_fail("status >= 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                        ,0xa48,"const Cluster *mkvparser::Segment::GetNext(const Cluster *)");
        }
      } while (lVar10 == 0);
      if (0 < lVar12) {
        ppCVar14 = local_48->m_clusters + local_48->m_clusterCount;
        ppCVar2 = ppCVar14 + local_48->m_clusterPreloadCount;
        ppCVar16 = ppCVar2;
        while (ppCVar14 < ppCVar16) {
          auVar5._8_8_ = (long)ppCVar16 - (long)ppCVar14 >> 0x3f;
          auVar5._0_8_ = (long)ppCVar16 - (long)ppCVar14 >> 3;
          ppCVar1 = ppCVar14 + SUB168(auVar5 / SEXT816(2),0);
          if (ppCVar2 <= ppCVar1) {
            __assert_fail("k < jj",
                          "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                          ,0xa63,"const Cluster *mkvparser::Segment::GetNext(const Cluster *)");
          }
          pCVar11 = *ppCVar1;
          if (pCVar11 == (Cluster *)0x0) {
            __assert_fail("pNext",
                          "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                          ,0xa66,"const Cluster *mkvparser::Segment::GetNext(const Cluster *)");
          }
          if (-1 < pCVar11->m_index) {
            __assert_fail("pNext->m_index < 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                          ,0xa67,"const Cluster *mkvparser::Segment::GetNext(const Cluster *)");
          }
          local_50 = pCVar11;
          lVar8 = Cluster::GetPosition(pCVar11);
          if (lVar8 < lVar12) {
            ppCVar14 = ppCVar1 + 1;
          }
          else {
            ppCVar16 = ppCVar1;
            if (lVar8 <= lVar12) {
              return local_50;
            }
          }
        }
        if (ppCVar14 != ppCVar16) {
          __assert_fail("i == j",
                        "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                        ,0xa77,"const Cluster *mkvparser::Segment::GetNext(const Cluster *)");
        }
        pCVar11 = Cluster::Create(pSVar6,-1,lVar12);
        if (pCVar11 != (Cluster *)0x0) {
          lVar15 = (long)ppCVar14 - (long)pSVar6->m_clusters;
          lVar13 = lVar15 >> 3;
          bVar7 = PreloadCluster(pSVar6,pCVar11,lVar13);
          if (bVar7) {
            if (pSVar6->m_clusters == (Cluster **)0x0) {
              __assert_fail("m_clusters",
                            "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                            ,0xa83,"const Cluster *mkvparser::Segment::GetNext(const Cluster *)");
            }
            if (lVar13 < pSVar6->m_clusterSize) {
              if (*(Cluster **)((long)pSVar6->m_clusters + lVar15) == pCVar11) {
                return pCVar11;
              }
              local_50 = pCVar11;
              __assert_fail("m_clusters[idx_next] == pNext",
                            "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                            ,0xa85,"const Cluster *mkvparser::Segment::GetNext(const Cluster *)");
            }
            __assert_fail("idx_next < m_clusterSize",
                          "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                          ,0xa84,"const Cluster *mkvparser::Segment::GetNext(const Cluster *)");
          }
          Cluster::~Cluster(pCVar11);
          operator_delete(pCVar11);
        }
      }
    }
LAB_001129d1:
    local_50 = (Cluster *)0x0;
  }
  else {
    uVar4 = this->m_clusterCount;
    if ((long)uVar4 < 1) {
      __assert_fail("m_clusterCount > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                    ,0x9e5,"const Cluster *mkvparser::Segment::GetNext(const Cluster *)");
    }
    if (uVar4 <= uVar3) {
      __assert_fail("idx < m_clusterCount",
                    "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                    ,0x9e6,"const Cluster *mkvparser::Segment::GetNext(const Cluster *)");
    }
    if (ppCVar2[uVar3] != pCurr) {
      __assert_fail("pCurr == m_clusters[idx]",
                    "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                    ,0x9e7,"const Cluster *mkvparser::Segment::GetNext(const Cluster *)");
    }
    if (uVar3 + 1 < uVar4) {
      pCVar11 = ppCVar2[uVar3 + 1];
      if (pCVar11 == (Cluster *)0x0) {
        __assert_fail("pNext",
                      "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                      ,0x9ef,"const Cluster *mkvparser::Segment::GetNext(const Cluster *)");
      }
      local_50 = pCVar11;
      if (pCVar11->m_index < 0) {
        __assert_fail("pNext->m_index >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                      ,0x9f0,"const Cluster *mkvparser::Segment::GetNext(const Cluster *)");
      }
      if (pCVar11->m_index != uVar3 + 1) {
        __assert_fail("pNext->m_index == idx",
                      "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                      ,0x9f1,"const Cluster *mkvparser::Segment::GetNext(const Cluster *)");
      }
    }
  }
  return local_50;
}

Assistant:

const Cluster* Segment::GetNext(const Cluster* pCurr) {
  assert(pCurr);
  assert(pCurr != &m_eos);
  assert(m_clusters);

  long idx = pCurr->m_index;

  if (idx >= 0) {
    assert(m_clusterCount > 0);
    assert(idx < m_clusterCount);
    assert(pCurr == m_clusters[idx]);

    ++idx;

    if (idx >= m_clusterCount)
      return &m_eos;  // caller will LoadCluster as desired

    Cluster* const pNext = m_clusters[idx];
    assert(pNext);
    assert(pNext->m_index >= 0);
    assert(pNext->m_index == idx);

    return pNext;
  }

  assert(m_clusterPreloadCount > 0);

  long long pos = pCurr->m_element_start;

  assert(m_size >= 0);  // TODO
  const long long stop = m_start + m_size;  // end of segment

  {
    long len;

    long long result = GetUIntLength(m_pReader, pos, len);
    assert(result == 0);
    assert((pos + len) <= stop);  // TODO
    if (result != 0)
      return NULL;

    const long long id = ReadID(m_pReader, pos, len);
    if (id != libwebm::kMkvCluster)
      return NULL;

    pos += len;  // consume ID

    // Read Size
    result = GetUIntLength(m_pReader, pos, len);
    assert(result == 0);  // TODO
    assert((pos + len) <= stop);  // TODO

    const long long size = ReadUInt(m_pReader, pos, len);
    assert(size > 0);  // TODO
    // assert((pCurr->m_size <= 0) || (pCurr->m_size == size));

    pos += len;  // consume length of size of element
    assert((pos + size) <= stop);  // TODO

    // Pos now points to start of payload

    pos += size;  // consume payload
  }

  long long off_next = 0;

  while (pos < stop) {
    long len;

    long long result = GetUIntLength(m_pReader, pos, len);
    assert(result == 0);
    assert((pos + len) <= stop);  // TODO
    if (result != 0)
      return NULL;

    const long long idpos = pos;  // pos of next (potential) cluster

    const long long id = ReadID(m_pReader, idpos, len);
    if (id < 0)
      return NULL;

    pos += len;  // consume ID

    // Read Size
    result = GetUIntLength(m_pReader, pos, len);
    assert(result == 0);  // TODO
    assert((pos + len) <= stop);  // TODO

    const long long size = ReadUInt(m_pReader, pos, len);
    assert(size >= 0);  // TODO

    pos += len;  // consume length of size of element
    assert((pos + size) <= stop);  // TODO

    // Pos now points to start of payload

    if (size == 0)  // weird
      continue;

    if (id == libwebm::kMkvCluster) {
      const long long off_next_ = idpos - m_start;

      long long pos_;
      long len_;

      const long status = Cluster::HasBlockEntries(this, off_next_, pos_, len_);

      assert(status >= 0);

      if (status > 0) {
        off_next = off_next_;
        break;
      }
    }

    pos += size;  // consume payload
  }

  if (off_next <= 0)
    return 0;

  Cluster** const ii = m_clusters + m_clusterCount;
  Cluster** i = ii;

  Cluster** const jj = ii + m_clusterPreloadCount;
  Cluster** j = jj;

  while (i < j) {
    // INVARIANT:
    //[0, i) < pos_next
    //[i, j) ?
    //[j, jj)  > pos_next

    Cluster** const k = i + (j - i) / 2;
    assert(k < jj);

    Cluster* const pNext = *k;
    assert(pNext);
    assert(pNext->m_index < 0);

    // const long long pos_ = pNext->m_pos;
    // assert(pos_);
    // pos = pos_ * ((pos_ < 0) ? -1 : 1);

    pos = pNext->GetPosition();

    if (pos < off_next)
      i = k + 1;
    else if (pos > off_next)
      j = k;
    else
      return pNext;
  }

  assert(i == j);

  Cluster* const pNext = Cluster::Create(this, -1, off_next);
  if (pNext == NULL)
    return NULL;

  const ptrdiff_t idx_next = i - m_clusters;  // insertion position

  if (!PreloadCluster(pNext, idx_next)) {
    delete pNext;
    return NULL;
  }
  assert(m_clusters);
  assert(idx_next < m_clusterSize);
  assert(m_clusters[idx_next] == pNext);

  return pNext;
}